

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          string *linkLibs,string *flags,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  cmOutputConverter *this_00;
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmMakefile *pcVar5;
  char *pcVar6;
  cmSourceFile *this_01;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  TargetType TVar10;
  int iVar11;
  long *plVar12;
  char *__s;
  string *psVar13;
  undefined8 *puVar14;
  ulong *puVar15;
  pointer ppcVar16;
  undefined8 uVar17;
  byte bVar18;
  char *pcVar19;
  char *__end;
  string configLinkFlags;
  string buildType;
  string linkLanguage;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_158;
  cmLocalGenerator *local_138;
  string local_130;
  string local_110;
  string local_f0;
  cmComputeLinkInformation *local_d0;
  string local_c8;
  string local_a8;
  cmLinkLineComputer *local_88;
  string *local_80;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_78;
  string *local_58;
  string local_50;
  
  local_138 = this;
  local_80 = linkLibs;
  cmsys::SystemTools::UpperCase(&local_f0,config);
  local_58 = config;
  local_d0 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_88 = linkLineComputer;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_a8,linkLineComputer,target,&local_f0);
  TVar10 = cmGeneratorTarget::GetType(target);
  switch(TVar10) {
  case EXECUTABLE:
    pcVar5 = local_138->Makefile;
    paVar2 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"CMAKE_EXE_LINKER_FLAGS","");
    cmMakefile::GetSafeDefinition(pcVar5,&local_158);
    std::__cxx11::string::append((char *)linkFlags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    if (local_f0._M_string_length != 0) {
      local_158._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"CMAKE_EXE_LINKER_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_f0._M_dataplus._M_p);
      cmMakefile::GetSafeDefinition(local_138->Makefile,&local_158);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_a8._M_string_length == 0) {
      psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmSystemTools::Error
                ("CMake can not determine linker language for target: ",(psVar13->_M_dataplus)._M_p,
                 (char *)0x0,(char *)0x0);
      goto LAB_003523e6;
    }
    AddLanguageFlagsForLinking(local_138,flags,target,&local_a8,&local_f0);
    if (local_d0 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(local_138,local_d0,local_88,local_80,frameworkPath,linkPath);
    }
    pcVar5 = local_138->Makefile;
    local_158._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"BUILD_SHARED_LIBS","");
    pcVar19 = cmMakefile::GetDefinition(pcVar5,&local_158);
    bVar7 = cmSystemTools::IsOn(pcVar19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_SHARED_BUILD_","");
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
      paVar3 = &local_130.field_2;
      puVar15 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_130.field_2._M_allocated_capacity = *puVar15;
        local_130.field_2._8_4_ = (undefined4)plVar12[3];
        local_130.field_2._12_4_ = *(undefined4 *)((long)plVar12 + 0x1c);
        local_130._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_130.field_2._M_allocated_capacity = *puVar15;
        local_130._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_130._M_string_length = plVar12[1];
      *plVar12 = (long)puVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      paVar4 = &local_110.field_2;
      local_110._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"_FLAGS","");
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar3) {
        uVar17 = local_130.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_110._M_string_length + local_130._M_string_length) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar4) {
          uVar17 = local_110.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_110._M_string_length + local_130._M_string_length)
        goto LAB_00352029;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_110,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
      }
      else {
LAB_00352029:
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_130,(ulong)local_110._M_dataplus._M_p);
      }
      psVar1 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_158.field_2._M_allocated_capacity = *psVar1;
        local_158.field_2._8_8_ = puVar14[3];
        local_158._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar1;
        local_158._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_158._M_string_length = puVar14[1];
      *puVar14 = psVar1;
      puVar14[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar4) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar3) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::GetSafeDefinition(local_138->Makefile,&local_158);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    local_158._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"WIN32_EXECUTABLE","");
    bVar7 = cmGeneratorTarget::GetPropertyAsBool(target,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = local_138->Makefile;
    if (bVar7) {
      local_158._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"CMAKE_CREATE_WIN32_EXE","");
      cmMakefile::GetSafeDefinition(pcVar5,&local_158);
      std::__cxx11::string::append((char *)linkFlags);
    }
    else {
      local_158._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"CMAKE_CREATE_CONSOLE_EXE","");
      cmMakefile::GetSafeDefinition(pcVar5,&local_158);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    bVar7 = cmGeneratorTarget::IsExecutableWithExports(target);
    if (bVar7) {
      local_158._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"CMAKE_EXE_EXPORTS_","");
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_a8._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_158);
      cmMakefile::GetSafeDefinition(local_138->Makefile,&local_158);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    GetLinkLibsCMP0065(&local_158,local_138,&local_a8,target);
    if (local_158._M_string_length != 0) {
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_158._M_dataplus._M_p);
      std::__cxx11::string::append((char *)linkFlags);
    }
    paVar3 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"LINK_FLAGS","");
    pcVar19 = cmGeneratorTarget::GetProperty(target,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar3) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (pcVar19 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_f0._M_string_length != 0) {
      local_130._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0._M_dataplus._M_p);
      pcVar19 = cmGeneratorTarget::GetProperty(target,&local_130);
      if (pcVar19 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar3) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags(local_138,linkFlags,&local_f0,target);
    break;
  case SHARED_LIBRARY:
    pcVar19 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_00351a40;
  case MODULE_LIBRARY:
    pcVar19 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_00351a40:
    pcVar5 = local_138->Makefile;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,pcVar19,pcVar19 + 0x19);
    __s = cmMakefile::GetSafeDefinition(pcVar5,&local_158);
    pcVar6 = (char *)linkFlags->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)linkFlags,0,pcVar6,(ulong)__s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    if (local_f0._M_string_length != 0) {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,pcVar19,pcVar19 + 0x19);
      std::__cxx11::string::append((char *)&local_158);
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_f0._M_dataplus._M_p);
      cmMakefile::GetSafeDefinition(local_138->Makefile,&local_158);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar5 = local_138->Makefile;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"WIN32","");
    bVar7 = cmMakefile::IsOn(pcVar5,&local_158);
    if (bVar7) {
      pcVar5 = local_138->Makefile;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"CYGWIN","");
      bVar8 = cmMakefile::IsOn(pcVar5,&local_130);
      bVar9 = true;
      if (!bVar8) {
        pcVar5 = local_138->Makefile;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"MINGW","");
        bVar9 = cmMakefile::IsOn(pcVar5,&local_c8);
      }
      bVar8 = !bVar8;
      bVar18 = bVar9 ^ 1;
    }
    else {
      bVar8 = false;
      bVar18 = 0;
    }
    if ((bVar8) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2)) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar7) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2)) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (bVar18 != 0) {
      local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetSourceFiles(target,&local_78,&local_f0);
      pcVar5 = local_138->Makefile;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"CMAKE_LINK_DEF_FILE_FLAG","");
      pcVar19 = cmMakefile::GetSafeDefinition(pcVar5,&local_110);
      std::__cxx11::string::string((string *)&local_158,pcVar19,(allocator *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if (local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = &local_138->super_cmOutputConverter;
        ppcVar16 = local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        do {
          this_01 = *ppcVar16;
          psVar13 = cmSourceFile::GetExtension_abi_cxx11_(this_01);
          iVar11 = std::__cxx11::string::compare((char *)psVar13);
          if (iVar11 == 0) {
            std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_158._M_dataplus._M_p);
            psVar13 = cmSourceFile::GetFullPath(this_01,(string *)0x0);
            cmsys::SystemTools::CollapseFullPath(&local_50,psVar13);
            cmOutputConverter::ConvertToOutputFormat(&local_110,this_00,&local_50,SHELL);
            std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_110._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)linkFlags);
          }
          ppcVar16 = ppcVar16 + 1;
        } while (ppcVar16 !=
                 local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if (local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"LINK_FLAGS","");
    pcVar19 = cmGeneratorTarget::GetProperty(target,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if (pcVar19 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_f0._M_string_length != 0) {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_f0._M_dataplus._M_p);
      pcVar19 = cmGeneratorTarget::GetProperty(target,&local_158);
      if (pcVar19 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_d0 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(local_138,local_d0,local_88,local_80,frameworkPath,linkPath);
    }
  }
  AppendIPOLinkerFlags(local_138,linkFlags,target,local_58,&local_a8);
LAB_003523e6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& flags, std::string& linkFlags,
  std::string& frameworkPath, std::string& linkPath, cmGeneratorTarget* target)
{
  const std::string buildType = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, buildType);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
      linkFlags += " ";
      if (!buildType.empty()) {
        std::string build = libraryLinkVariable;
        build += "_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
      }
      if (this->Makefile->IsOn("WIN32") &&
          !(this->Makefile->IsOn("CYGWIN") || this->Makefile->IsOn("MINGW"))) {
        std::vector<cmSourceFile*> sources;
        target->GetSourceFiles(sources, buildType);
        std::string defFlag =
          this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
        for (std::vector<cmSourceFile*>::const_iterator i = sources.begin();
             i != sources.end(); ++i) {
          cmSourceFile* sf = *i;
          if (sf->GetExtension() == "def") {
            linkFlags += defFlag;
            linkFlags += this->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(sf->GetFullPath()), SHELL);
            linkFlags += " ";
          }
        }
      }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      linkFlags += this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
      linkFlags += " ";
      if (!buildType.empty()) {
        std::string build = "CMAKE_EXE_LINKER_FLAGS_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
      }
      if (linkLanguage.empty()) {
        cmSystemTools::Error(
          "CMake can not determine linker language for target: ",
          target->GetName().c_str());
        return;
      }
      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, buildType);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
      if (cmSystemTools::IsOn(
            this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_") +
          linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
      }
      if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
        linkFlags += " ";
      } else {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
        linkFlags += " ";
      }
      if (target->IsExecutableWithExports()) {
        std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
        exportFlagVar += linkLanguage;
        exportFlagVar += "_FLAG";

        linkFlags += this->Makefile->GetSafeDefinition(exportFlagVar);
        linkFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        linkFlags += cmp0065Flags;
        linkFlags += " ";
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }
    } break;
    default:
      break;
  }

  this->AppendIPOLinkerFlags(linkFlags, target, config, linkLanguage);
}